

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

uint FindGivenVersion(TidyDocImpl *doc,Node *doctype)

{
  ctmbstr s1;
  int iVar1;
  AttVal *pAVar2;
  tmbstr ptVar3;
  uint uVar4;
  ctmbstr ptVar5;
  long lVar6;
  
  pAVar2 = prvTidyGetAttrByName(doctype,"PUBLIC");
  if ((pAVar2 == (AttVal *)0x0) || (ptVar5 = pAVar2->value, ptVar5 == (ctmbstr)0x0)) {
    if ((doctype->element == (ctmbstr)0x0) ||
       (iVar1 = prvTidytmbstrcasecmp(doctype->element,"html"), iVar1 != 0)) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0x60000;
    }
  }
  else {
    lVar6 = 0x18;
    do {
      s1 = *(ctmbstr *)((long)&W3C_Doctypes[0].score + lVar6);
      if ((s1 != (ctmbstr)0x0) && (iVar1 = prvTidytmbstrcasecmp(s1,ptVar5), iVar1 == 0)) {
        uVar4 = *(uint *)((long)CheckSvgAttr::values_6 + lVar6 + 0xc);
        goto LAB_00147940;
      }
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0x310);
    uVar4 = 0;
LAB_00147940:
    if ((uVar4 & 0x41f00) != 0) {
      prvTidySetOptionBool(doc,TidyXmlOut,yes);
      prvTidySetOptionBool(doc,TidyXhtmlOut,yes);
      doc->lexer->isvoyager = yes;
    }
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar2->value);
    lVar6 = 0x18;
    ptVar5 = (ctmbstr)0x0;
    do {
      if (*(uint *)((long)CheckSvgAttr::values_6 + lVar6 + 0xc) == uVar4) {
        ptVar5 = *(ctmbstr *)((long)&W3C_Doctypes[0].score + lVar6);
        break;
      }
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0x310);
    ptVar3 = prvTidytmbstrdup(doc->allocator,ptVar5);
    pAVar2->value = ptVar3;
  }
  return uVar4;
}

Assistant:

static uint FindGivenVersion( TidyDocImpl* doc, Node* doctype )
{
    AttVal * fpi = TY_(GetAttrByName)(doctype, "PUBLIC");
    uint vers;

    if (!fpi || !fpi->value) 
    {
        /*\
         * Is. #815 - change to case-insensitive test
         * See REC: https://www.w3.org/TR/html5/syntax.html#the-doctype
        \*/
        if (doctype->element && (TY_(tmbstrcasecmp)(doctype->element,"html") == 0))
        {
            return VERS_HTML5;  /* TODO: do we need to check MORE? */
        }
        /* TODO: Consider warning, error message */
        return VERS_UNKNOWN;
    }
    vers = GetVersFromFPI(fpi->value);

    if (VERS_XHTML & vers)
    {
        TY_(SetOptionBool)(doc, TidyXmlOut, yes);
        TY_(SetOptionBool)(doc, TidyXhtmlOut, yes);
        doc->lexer->isvoyager = yes;
    }

    /* todo: add a warning if case does not match? */
    TidyDocFree(doc, fpi->value);
    fpi->value = TY_(tmbstrdup)(doc->allocator, GetFPIFromVers(vers));

    return vers;
}